

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_wd_add_subtree(lyd_node **root,lyd_node *last_parent,lyd_node *subroot,lys_node *schema,
                      int toplevel,int options,unres_data *unres)

{
  long lVar1;
  lyd_node *plVar2;
  lys_ext_instance **pplVar3;
  bool bVar4;
  int iVar5;
  LYS_NODE LVar6;
  uint uVar7;
  ly_set *set;
  lys_node *plVar8;
  lys_node *plVar9;
  ulong uVar10;
  lys_node *node;
  lyd_node *plVar11;
  lys_ext_instance ***ppplVar12;
  ulong uVar13;
  UNRES_ITEM UVar14;
  long lVar15;
  lys_node **pplVar16;
  lyd_node **pplVar17;
  lyd_node *plVar18;
  ulong local_60;
  lyd_node *local_48;
  lyd_node *local_38;
  
  if (((options & 0x10000ffU) != 0) && ((schema->flags & 2) != 0)) {
    return 0;
  }
  if ((toplevel == 0) ||
     ((schema->nodetype & (LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) == LYS_UNKNOWN)) {
    plVar9 = schema;
    if (subroot == (lyd_node *)0x0) {
      while (plVar9 = plVar9->parent, plVar9 != (lys_node *)0x0) {
        if ((plVar9->nodetype & (LYS_USES|LYS_CHOICE)) == LYS_UNKNOWN) {
          if ((plVar9->nodetype == LYS_AUGMENT) &&
             (plVar9 = lys_is_disabled(plVar9,0), plVar9 != (lys_node *)0x0)) {
            return 0;
          }
          break;
        }
        plVar8 = lys_is_disabled(plVar9,0);
        if (plVar8 != (lys_node *)0x0) {
          return 0;
        }
      }
      plVar9 = lys_is_disabled(schema,0);
      if (plVar9 != (lys_node *)0x0) {
        return 0;
      }
    }
    LVar6 = schema->nodetype;
    set = (ly_set *)0x0;
    switch(LVar6) {
    case LYS_CONTAINER:
      if (subroot == (lyd_node *)0x0) {
        bVar4 = false;
        lVar1._0_2_ = schema[1].flags;
        lVar1._2_1_ = schema[1].ext_size;
        lVar1._3_1_ = schema[1].iffeature_size;
        lVar1._4_1_ = schema[1].padding[0];
        lVar1._5_1_ = schema[1].padding[1];
        lVar1._6_1_ = schema[1].padding[2];
        lVar1._7_1_ = schema[1].padding[3];
        if (lVar1 == 0) {
          local_48 = _lyd_new(last_parent,schema,1);
          local_48->validity = local_48->validity & 0xfb;
          if (unres->store_diff == 0) {
LAB_00169cb5:
            if (last_parent == (lyd_node *)0x0) {
              if (*root == (lyd_node *)0x0) {
                *root = local_48;
              }
              else {
                lyd_insert_common((*root)->parent,root,local_48,0);
              }
            }
            local_38 = local_48;
            if (((options & 0x8eU) == 0) &&
               ((((local_48->field_0x9 & 8) != 0 &&
                 (iVar5 = unres_data_add(unres,local_48,UNRES_WHEN), iVar5 == -1)) ||
                (((options & 0x208eU) == 0 &&
                 (((uVar7 = resolve_applies_must(local_48), (uVar7 & 1) != 0 &&
                   (iVar5 = unres_data_add(unres,local_48,UNRES_MUST), iVar5 == -1)) ||
                  (((uVar7 & 2) != 0 &&
                   (iVar5 = unres_data_add(unres,local_48,UNRES_MUST_INOUT), iVar5 == -1))))))))))
            goto LAB_0016a248;
            goto LAB_00169ae1;
          }
          set = (ly_set *)0x0;
          iVar5 = unres_data_diff_new(unres,local_48,(lyd_node *)0x0,1);
          if (iVar5 == 0) {
            unres->store_diff = 0;
            bVar4 = true;
            goto LAB_00169cb5;
          }
          goto LAB_0016a24b;
        }
LAB_00169da4:
        set = (ly_set *)0x0;
      }
      else {
LAB_00169ac6:
        lVar15._0_2_ = schema[1].flags;
        lVar15._2_1_ = schema[1].ext_size;
        lVar15._3_1_ = schema[1].iffeature_size;
        lVar15._4_1_ = schema[1].padding[0];
        lVar15._5_1_ = schema[1].padding[1];
        lVar15._6_1_ = schema[1].padding[2];
        lVar15._7_1_ = schema[1].padding[3];
        if (lVar15 == 0) {
          subroot->field_0x9 = subroot->field_0x9 | 1;
        }
LAB_00169ad9:
        bVar4 = false;
        local_48 = last_parent;
        local_38 = subroot;
LAB_00169ae1:
        set = ly_set_new();
        if (set == (ly_set *)0x0) goto LAB_0016a248;
        pplVar16 = &schema->child;
        while (plVar9 = *pplVar16, plVar9 != (lys_node *)0x0) {
          plVar11 = local_38;
          if ((plVar9->nodetype & (LYS_USES|LYS_CHOICE)) == LYS_UNKNOWN) {
            if ((plVar9->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) !=
                LYS_UNKNOWN) {
              if ((local_38 == (lyd_node *)0x0) ||
                 (iVar5 = lyd_get_node_siblings(local_38->child,plVar9,set), iVar5 == 0)) {
                plVar11 = (lyd_node *)0x0;
                goto LAB_00169b1d;
              }
              if ((plVar9->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
                if (plVar9->nodetype != LYS_LEAF) {
                  lVar15 = 0;
                  while (lVar15 < (int)set->number) {
                    iVar5 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar15],
                                               (lyd_node *)(set->set).s[lVar15],plVar9,toplevel,
                                               options,unres);
                    lVar15 = lVar15 + 1;
                    if (iVar5 != 0) goto LAB_0016a24b;
                  }
                }
              }
              else {
                lyd_wd_leaflist_cleanup(set,unres);
              }
              if ((local_38->field_0x9 & 1) != 0) {
                uVar10 = (ulong)set->number;
                if ((int)set->number < 1) {
                  uVar10 = 0;
                }
                uVar13 = 0;
                do {
                  if (uVar10 == uVar13) goto LAB_00169bd9;
                  pplVar16 = (set->set).s + uVar13;
                  uVar13 = uVar13 + 1;
                } while (((ulong)(*pplVar16)->dsc & 0x100) != 0);
                for (; (plVar11 != (lyd_node *)0x0 && ((plVar11->field_0x9 & 1) != 0));
                    plVar11 = plVar11->parent) {
                  plVar11->field_0x9 = plVar11->field_0x9 & 0xfe;
                }
              }
LAB_00169bd9:
              set->number = 0;
            }
          }
          else {
LAB_00169b1d:
            iVar5 = lyd_wd_add_subtree(root,local_48,plVar11,plVar9,toplevel,options,unres);
            if (iVar5 != 0) goto LAB_0016a24b;
          }
          pplVar16 = &plVar9->next;
        }
        if (bVar4) {
          unres->store_diff = 1;
        }
      }
      break;
    case LYS_CHOICE:
      if (toplevel == 0) {
        if (subroot != (lyd_node *)0x0) goto LAB_00169cf2;
LAB_00169d76:
        plVar9 = (lys_node *)schema[1].name;
        if (plVar9 == (lys_node *)0x0) goto LAB_00169da4;
      }
      else {
        if (*root == (lyd_node *)0x0) goto LAB_00169d76;
LAB_00169cf2:
        pplVar17 = &subroot->child;
        if (toplevel != 0) {
          pplVar17 = root;
        }
        do {
          plVar11 = *pplVar17;
          if (plVar11 == (lyd_node *)0x0) goto LAB_00169d76;
          plVar8 = lys_parent(plVar11->schema);
          plVar9 = plVar11->schema;
          while (((node = plVar8, node != (lys_node *)0x0 && (node != schema)) &&
                 ((node->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
            plVar8 = lys_parent(node);
            plVar9 = node;
          }
          pplVar17 = &plVar11->next;
        } while (node != schema);
        if ((schema == (lys_node *)0x0) || (plVar9 == (lys_node *)0x0)) {
          __assert_fail("siter && siter_prev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1d59,
                        "int lyd_wd_add_subtree(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int, struct unres_data *)"
                       );
        }
      }
      iVar5 = lyd_wd_add_subtree(root,last_parent,subroot,plVar9,toplevel,options,unres);
      set = (ly_set *)0x0;
      goto LAB_00169a58;
    case LYS_CHOICE|LYS_CONTAINER:
    case LYS_LEAF|LYS_CONTAINER:
    case LYS_LEAF|LYS_CHOICE:
    case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
      break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
      if (subroot == (lyd_node *)0x0) {
        set = (ly_set *)0x0;
      }
      else {
        set = ly_set_new();
        if (set == (ly_set *)0x0) goto LAB_0016a248;
        lyd_get_node_siblings(subroot->child,schema,set);
        uVar7 = set->number;
        if (uVar7 != 0) {
          if ((subroot->field_0x9 & 1) != 0) {
            uVar13 = 0;
            uVar10 = (ulong)uVar7;
            if ((int)uVar7 < 1) {
              uVar10 = uVar13;
            }
            do {
              if (uVar10 == uVar13) goto switchD_001699d4_caseD_3;
              pplVar16 = (set->set).s + uVar13;
              uVar13 = uVar13 + 1;
            } while (((ulong)(*pplVar16)->dsc & 0x100) != 0);
            for (; (subroot != (lyd_node *)0x0 && ((subroot->field_0x9 & 1) != 0));
                subroot = subroot->parent) {
              subroot->field_0x9 = subroot->field_0x9 & 0xfe;
            }
          }
          break;
        }
        LVar6 = schema->nodetype;
      }
      if (LVar6 == LYS_LEAF) {
        plVar9 = schema[1].prev;
        if (plVar9 == (lys_node *)0x0) {
          if ((schema->flags & 0x40) == 0) {
            ppplVar12 = &schema[1].ext;
            plVar9 = (lys_node *)0x0;
            while ((pplVar3 = *ppplVar12, pplVar3 != (lys_ext_instance **)0x0 &&
                   (plVar9 == (lys_node *)0x0))) {
              ppplVar12 = (lys_ext_instance ***)(pplVar3 + 9);
              plVar9 = (lys_node *)pplVar3[0xf];
            }
            if (plVar9 != (lys_node *)0x0) goto LAB_00169dd6;
          }
        }
        else {
LAB_00169dd6:
          plVar11 = lyd_new_dummy(*root,last_parent,schema,(char *)plVar9,1);
          if (((plVar11 == (lyd_node *)0x0) ||
              ((unres->store_diff != 0 &&
               (iVar5 = unres_data_diff_new(unres,plVar11,(lyd_node *)0x0,1), iVar5 != 0)))) ||
             ((plVar18 = plVar11, plVar11->parent == (lyd_node *)0x0 &&
              ((*root != (lyd_node *)0x0 && (iVar5 = lyd_insert_sibling(root,plVar11), iVar5 != 0)))
              ))) goto LAB_0016a116;
          while( true ) {
            if (((options & 0x8eU) == 0) &&
               ((((plVar18->field_0x9 & 8) != 0 &&
                 (iVar5 = unres_data_add(unres,plVar18,UNRES_WHEN), iVar5 == -1)) ||
                (((options & 0x208eU) == 0 &&
                 (((uVar7 = resolve_applies_must(plVar18), (uVar7 & 1) != 0 &&
                   (iVar5 = unres_data_add(unres,plVar18,UNRES_MUST), iVar5 == -1)) ||
                  (((uVar7 & 2) != 0 &&
                   (iVar5 = unres_data_add(unres,plVar18,UNRES_MUST_INOUT), iVar5 == -1))))))))))
            goto LAB_0016a116;
            plVar18->validity = plVar18->validity & 0x7f;
            if (plVar18->schema == schema) break;
            plVar18 = plVar18->child;
          }
          lyd_wd_update_parents(plVar11);
          if (*(int *)&plVar18[1].schema == 8) {
            UVar14 = UNRES_INSTID;
LAB_0016a10d:
            iVar5 = unres_data_add(unres,plVar18,UVar14);
            if (iVar5 != 0) {
LAB_0016a116:
              lyd_free(plVar11);
              return 1;
            }
          }
          else if (*(int *)&plVar18[1].schema == 9) {
            UVar14 = UNRES_LEAFREF;
            goto LAB_0016a10d;
          }
          if (*root == (lyd_node *)0x0) {
            *root = plVar11;
          }
        }
      }
      else if ((schema->module->field_0x40 & 0xc) != 0) {
        local_60 = (ulong)schema->padding[2];
        if (local_60 == 0) {
          if (*(int *)&schema[1].priv == 0) {
            ppplVar12 = &schema[1].ext;
            while (pplVar3 = *ppplVar12, pplVar3 != (lys_ext_instance **)0x0) {
              if (pplVar3[0xf] != (lys_ext_instance *)0x0) {
                plVar9 = (lys_node *)(pplVar3 + 0xf);
                local_60 = 1;
                goto LAB_00169ef0;
              }
              ppplVar12 = (lys_ext_instance ***)(pplVar3 + 9);
            }
          }
        }
        else {
          plVar9 = schema[1].prev;
LAB_00169ef0:
          local_38 = (lyd_node *)0x0;
          for (uVar10 = 0; uVar10 != local_60; uVar10 = uVar10 + 1) {
            plVar11 = lyd_new_dummy(*root,last_parent,schema,
                                    *(char **)(plVar9->padding + uVar10 * 8 + -0x1c),1);
            if ((plVar11 == (lyd_node *)0x0) ||
               ((unres->store_diff != 0 &&
                (iVar5 = unres_data_diff_new(unres,plVar11,(lyd_node *)0x0,1), iVar5 != 0))))
            goto LAB_0016a069;
            plVar18 = plVar11;
            if ((local_38 != (lyd_node *)0x0) &&
               (plVar18 = local_38, plVar11->parent == (lyd_node *)0x0)) {
              plVar2 = local_38->prev;
              plVar2->next = plVar11;
              plVar11->prev = plVar2;
              local_38->prev = plVar11;
            }
            while( true ) {
              local_38 = plVar18;
              if (((options & 0x8eU) == 0) &&
                 ((((plVar11->field_0x9 & 8) != 0 &&
                   (iVar5 = unres_data_add(unres,plVar11,UNRES_WHEN), iVar5 == -1)) ||
                  (((options & 0x208eU) == 0 &&
                   (((uVar7 = resolve_applies_must(plVar11), (uVar7 & 1) != 0 &&
                     (iVar5 = unres_data_add(unres,plVar11,UNRES_MUST), iVar5 == -1)) ||
                    (((uVar7 & 2) != 0 &&
                     (iVar5 = unres_data_add(unres,plVar11,UNRES_MUST_INOUT), iVar5 == -1))))))))))
              goto LAB_0016a069;
              plVar11->validity = plVar11->validity & 0x7f;
              if (plVar11->schema == schema) break;
              plVar11 = plVar11->child;
              plVar18 = local_38;
            }
            if (*(int *)&plVar11[1].schema == 8) {
              UVar14 = UNRES_INSTID;
LAB_0016a01f:
              iVar5 = unres_data_add(unres,plVar11,UVar14);
              if (iVar5 != 0) goto LAB_0016a069;
            }
            else if (*(int *)&plVar11[1].schema == 9) {
              UVar14 = UNRES_LEAFREF;
              goto LAB_0016a01f;
            }
          }
          if ((local_38 == (lyd_node *)0x0) || (local_38->parent != (lyd_node *)0x0)) {
            if (*root == (lyd_node *)0x0) goto LAB_0016a213;
          }
          else if (*root == (lyd_node *)0x0) {
LAB_0016a213:
            *root = local_38;
          }
          else {
            iVar5 = lyd_insert_sibling(root,local_38);
            if (iVar5 != 0) {
LAB_0016a069:
              lyd_free_withsiblings(local_38);
              goto LAB_0016a24b;
            }
          }
          lyd_wd_update_parents(local_38);
        }
      }
      break;
    default:
      if ((((LVar6 == LYS_USES) || (LVar6 == LYS_CASE)) || (LVar6 == LYS_NOTIF)) ||
         ((LVar6 == LYS_INPUT || (LVar6 == LYS_OUTPUT)))) goto LAB_00169ad9;
      set = (ly_set *)0x0;
      if (LVar6 == LYS_LIST) {
        if (subroot == (lyd_node *)0x0) goto LAB_00169da4;
        goto LAB_00169ac6;
      }
    }
switchD_001699d4_caseD_3:
    ly_set_free(set);
    iVar5 = 0;
  }
  else {
    set = ly_set_new();
    if (set == (ly_set *)0x0) {
LAB_0016a248:
      set = (ly_set *)0x0;
    }
    else {
      if ((*root != (lyd_node *)0x0) &&
         (iVar5 = lyd_get_node_siblings(*root,schema,set), iVar5 != 0)) {
        for (lVar15 = 0; lVar15 < (int)set->number; lVar15 = lVar15 + 1) {
          if ((schema->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
            if ((schema->nodetype != LYS_LEAF) &&
               (iVar5 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar15],
                                           (lyd_node *)(set->set).s[lVar15],schema,0,options,unres),
               iVar5 != 0)) goto LAB_0016a24b;
          }
          else {
            lyd_wd_leaflist_cleanup(set,unres);
          }
        }
        goto switchD_001699d4_caseD_3;
      }
      iVar5 = lyd_wd_add_subtree(root,last_parent,(lyd_node *)0x0,schema,0,options,unres);
LAB_00169a58:
      if (iVar5 == 0) goto switchD_001699d4_caseD_3;
    }
LAB_0016a24b:
    iVar5 = 1;
    ly_set_free(set);
  }
  return iVar5;
}

Assistant:

static int
lyd_wd_add_subtree(struct lyd_node **root, struct lyd_node *last_parent, struct lyd_node *subroot,
                   struct lys_node *schema, int toplevel, int options, struct unres_data *unres)
{
    struct ly_set *present = NULL;
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    int i, check_when_must, storing_diff = 0;

    assert(root);

    if ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R)) {
        /* non LYD_OPT_DATA tree, status data are not expected here */
        return EXIT_SUCCESS;
    }

    if (options & (LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        check_when_must = 0; /* check neither */
    } else if (options & LYD_OPT_TRUSTED) {
        check_when_must = 1; /* check only when */
    } else {
        check_when_must = 2; /* check both when and must */
    }

    if (toplevel && (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_CONTAINER))) {
        /* search for the schema node instance */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((*root) && lyd_get_node_siblings(*root, schema, present)) {
            /* there are some instances */
            for (i = 0; i < (signed)present->number; i++) {
                if (schema->nodetype & LYS_LEAFLIST) {
                    lyd_wd_leaflist_cleanup(present, unres);
                } else if (schema->nodetype != LYS_LEAF) {
                    if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], schema, 0, options, unres)) {
                        goto error;
                    }
                } /* else LYS_LEAF - nothing to do */
            }
        } else {
            /* no instance */
            if (lyd_wd_add_subtree(root, last_parent, NULL, schema, 0, options, unres)) {
                goto error;
            }
        }

        ly_set_free(present);
        return EXIT_SUCCESS;
    }

    /* skip disabled parts of schema */
    if (!subroot) {
        /* go through all the uses and check whether they are enabled */
        for (siter = schema->parent; siter && (siter->nodetype & (LYS_USES | LYS_CHOICE)); siter = siter->parent) {
            if (lys_is_disabled(siter, 0)) {
                /* ignore disabled uses nodes */
                return EXIT_SUCCESS;
            }
        }

        /* check augment state */
        if (siter && siter->nodetype == LYS_AUGMENT) {
            if (lys_is_disabled(siter, 0)) {
                /* ignore disabled augment */
                return EXIT_SUCCESS;
            }
        }

        /* check the node itself */
        if (lys_is_disabled(schema, 0)) {
            /* ignore disabled data */
            return EXIT_SUCCESS;
        }
    }

    /* go recursively */
    switch (schema->nodetype) {
    case LYS_LIST:
        if (!subroot) {
            /* stop recursion */
            break;
        }
        /* falls through */
    case LYS_CONTAINER:
        if (!subroot) {
            /* container does not exists, continue only in case of non presence container */
            if (((struct lys_node_container *)schema)->presence) {
                /* stop recursion */
                break;
            }
            /* always create empty NP container even if there is no default node,
             * because accroding to RFC, the empty NP container is always part of
             * accessible tree (e.g. for evaluating when and must conditions) */
            subroot = _lyd_new(last_parent, schema, 1);
            /* useless to set mand flag */
            subroot->validity &= ~LYD_VAL_MAND;

            if (unres->store_diff) {
                /* remember this container in the diff */
                if (unres_data_diff_new(unres, subroot, NULL, 1)) {
                    goto error;
                }

                /* do not store diff for recursive calls, created values will be connected to this one */
                storing_diff = 1;
                unres->store_diff = 0;
            }

            if (!last_parent) {
                if (*root) {
                    lyd_insert_common((*root)->parent, root, subroot, 0);
                } else {
                    *root = subroot;
                }
            }
            last_parent = subroot;

            /* remember the created container in unres */
            if (check_when_must) {
                if ((subroot->when_status & LYD_WHEN) && unres_data_add(unres, subroot, UNRES_WHEN) == -1) {
                    goto error;
                }
                if (check_when_must == 2) {
                    i = resolve_applies_must(subroot);
                    if ((i & 0x1) && (unres_data_add(unres, subroot, UNRES_MUST) == -1)) {
                        goto error;
                    }
                    if ((i & 0x2) && (unres_data_add(unres, subroot, UNRES_MUST_INOUT) == -1)) {
                        goto error;
                    }
                }
            }
        } else if (!((struct lys_node_container *)schema)->presence) {
            /* fix default flag on existing containers - set it on all non-presence containers and in case we will
             * have in recursion function some non-default node, it will unset it */
            subroot->dflt = 1;
        }
        /* falls through */
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:

        /* recursion */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        LY_TREE_FOR(schema->child, siter) {
            if (siter->nodetype & (LYS_CHOICE | LYS_USES)) {
                /* go into without searching for data instance */
                if (lyd_wd_add_subtree(root, last_parent, subroot, siter, toplevel, options, unres)) {
                    goto error;
                }
            } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) {
                /* search for the schema node instance */
                if (subroot && lyd_get_node_siblings(subroot->child, siter, present)) {
                    /* there are some instances in the data root */
                    if (siter->nodetype & LYS_LEAFLIST) {
                        /* already have some leaflists, check that they are all
                         * default, if not, remove the default leaflists */
                        lyd_wd_leaflist_cleanup(present, unres);
                    } else if (siter->nodetype != LYS_LEAF) {
                        /* recursion */
                        for (i = 0; i < (signed)present->number; i++) {
                            if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], siter, toplevel, options,
                                                   unres)) {
                                goto error;
                            }
                        }
                    } /* else LYS_LEAF - nothing to do */

                    /* fix default flag (2nd part) - for non-default node with default parent, unset the default flag
                     * from the parents (starting from subroot node) */
                    if (subroot->dflt) {
                        for (i = 0; i < (signed)present->number; i++) {
                            if (!present->set.d[i]->dflt) {
                                for (iter = subroot; iter && iter->dflt; iter = iter->parent) {
                                    iter->dflt = 0;
                                }
                                break;
                            }
                        }
                    }
                    ly_set_clean(present);
                } else {
                    /* no instance */
                    if (lyd_wd_add_subtree(root, last_parent, NULL, siter, toplevel, options, unres)) {
                        goto error;
                    }
                }
            }
        }

        if (storing_diff) {
            /* continue generating the diff in functions above this one */
            unres->store_diff = 1;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        if (subroot) {
            /* default shortcase of a choice */
            present = ly_set_new();
            if (!present) {
                goto error;
            }
            lyd_get_node_siblings(subroot->child, schema, present);
            if (present->number) {
                /* the shortcase leaf(-list) exists, stop the processing and fix default flags */
                if (subroot->dflt) {
                    for (i = 0; i < (signed)present->number; i++) {
                        if (!present->set.d[i]->dflt) {
                            for (iter = subroot; iter && iter->dflt; iter = iter->parent) {
                                iter->dflt = 0;
                            }
                            break;
                        }
                    }
                }
                break;
            }
        }
        if (schema->nodetype == LYS_LEAF) {
            if (lyd_wd_add_leaf(root, last_parent, (struct lys_node_leaf*)schema, unres, check_when_must)) {
                return EXIT_FAILURE;
            }
        } else { /* LYS_LEAFLIST */
            if (lyd_wd_add_leaflist(root, last_parent, (struct lys_node_leaflist*)schema, unres, check_when_must)) {
                goto error;
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data root from the choice */
        iter = NULL;
        if ((toplevel && (*root)) || (!toplevel && subroot)) {
            LY_TREE_FOR(toplevel ? (*root) : subroot->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_wd_add_subtree(root, last_parent, subroot, ((struct lys_node_choice *)schema)->dflt,
                                       toplevel, options, unres)) {
                    goto error;
                }
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_wd_add_subtree(root, last_parent, subroot, siter_prev, toplevel, options, unres)) {
                goto error;
            }
        }
        break;
    default:
        /* LYS_ANYXML, LYS_ANYDATA, LYS_USES, LYS_GROUPING - do nothing */
        break;
    }

    ly_set_free(present);
    return EXIT_SUCCESS;

error:
    ly_set_free(present);
    return EXIT_FAILURE;
}